

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::DEC_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint16_t result;
  uint16_t addr;
  CPU *this_local;
  
  this->cycles = 7;
  uVar2 = GetWord(this);
  uVar2 = uVar2 + this->X;
  bVar1 = ReadByte(this,uVar2);
  uVar3 = bVar1 - 1;
  this->cycles = this->cycles - 2;
  WriteByte(this,uVar2,(uint8_t)uVar3);
  (this->field_6).ps = (this->field_6).ps & 0xfd | (uVar3 == 0) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((uVar3 & 0x80) != 0 && -1 < (int)(uVar3 & 0x80)) << 7;
  return;
}

Assistant:

void CPU::DEC_AB_X()
{
    cycles = 7;
    uint16_t addr = GetWord() + X, result = ReadByte(addr) - 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}